

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* reduce_rows_cols(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *__return_storage_ptr__,
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *mtrx,tuple<int,_int> *tpl)

{
  int iVar1;
  pointer pvVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  int j;
  long lVar6;
  pointer pvVar7;
  bool bVar8;
  
  lVar5 = (long)(tpl->super__Tuple_impl<0UL,_int,_int>).super__Head_base<0UL,_int,_false>.
                _M_head_impl;
  pvVar2 = (mtrx->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = *(long *)&pvVar2[lVar5 + -1].super__Vector_base<double,_std::allocator<double>_>._M_impl;
  pdVar3 = *(pointer *)
            ((long)&pvVar2[lVar5 + -1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + 8);
  for (lVar6 = 0; (long)pdVar3 - lVar4 >> 3 != lVar6; lVar6 = lVar6 + 1) {
    *(undefined8 *)(lVar4 + lVar6 * 8) = 0x7ff8000000000000;
  }
  lVar4 = ((long)(mtrx->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18;
  iVar1 = (tpl->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
          super__Head_base<1UL,_int,_false>._M_head_impl;
  pvVar7 = pvVar2;
  while (bVar8 = lVar4 != 0, lVar4 = lVar4 + -1, bVar8) {
    *(undefined8 *)
     (*(long *)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data + -8 + (long)iVar1 * 8) = 0x7ff8000000000000;
    pvVar7 = pvVar7 + 1;
  }
  *(undefined8 *)
   (*(long *)&pvVar2[(long)(tpl->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
                           super__Head_base<1UL,_int,_false>._M_head_impl + -1].
              super__Vector_base<double,_std::allocator<double>_>._M_impl + -8 + lVar5 * 8) =
       0x7ff8000000000000;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,mtrx);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<double>> reduce_rows_cols(std::vector<std::vector<double>> &mtrx, std::tuple<int,int> &tpl){
    for(int j=0; j< mtrx[std::get<0>(tpl)-1].size(); j++){
        mtrx[std::get<0>(tpl)-1][j] = INF;
    }
    for(int i =0; i<mtrx.size();i++){
        mtrx[i][std::get<1>(tpl)-1] = INF;
    }
    mtrx[std::get<1>(tpl)-1][std::get<0>(tpl)-1] = INF;
    return mtrx;
}